

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_set_decode_area
                   (opj_j2k_t *p_j2k,opj_image_t *p_image,OPJ_INT32 p_start_x,OPJ_INT32 p_start_y,
                   OPJ_INT32 p_end_x,OPJ_INT32 p_end_y,opj_event_mgr_t *p_manager)

{
  byte *pbVar1;
  opj_image_t *poVar2;
  opj_image_comp_t *poVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  undefined1 auVar6 [16];
  OPJ_UINT32 OVar7;
  OPJ_BOOL OVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  
  auVar6 = _DAT_0013c070;
  uVar9 = (ulong)(uint)p_start_x;
  poVar2 = p_j2k->m_private_image;
  if (((((p_j2k->m_cp).tw != 1) || ((p_j2k->m_cp).th != 1)) ||
      (((p_j2k->m_cp).tcps)->m_data == (OPJ_BYTE *)0x0)) &&
     ((p_j2k->m_specific_param).m_decoder.m_state != 8)) {
    opj_event_msg(p_manager,1,
                  "Need to decode the main header before begin to decode the remaining codestream.\n"
                 );
    return 0;
  }
  uVar11 = (ulong)p_image->numcomps;
  if (uVar11 != 0) {
    poVar3 = p_image->comps;
    OVar7 = (p_j2k->m_cp).m_specific_param.m_dec.m_reduce;
    lVar12 = uVar11 - 1;
    auVar14._8_4_ = (int)lVar12;
    auVar14._0_8_ = lVar12;
    auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar13 = 0;
    auVar14 = auVar14 ^ _DAT_0013c070;
    auVar16 = _DAT_0013c050;
    auVar17 = _DAT_0013c060;
    do {
      auVar18 = auVar17 ^ auVar6;
      iVar15 = auVar14._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar15 && auVar14._0_4_ < auVar18._0_4_ ||
                  iVar15 < auVar18._4_4_) & 1)) {
        *(OPJ_UINT32 *)((long)&poVar3->factor + uVar13) = OVar7;
      }
      if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
          auVar18._12_4_ <= auVar14._12_4_) {
        *(OPJ_UINT32 *)((long)&poVar3[1].factor + uVar13) = OVar7;
      }
      auVar18 = auVar16 ^ auVar6;
      iVar19 = auVar18._4_4_;
      if (iVar19 <= iVar15 && (iVar19 != iVar15 || auVar18._0_4_ <= auVar14._0_4_)) {
        *(OPJ_UINT32 *)((long)&poVar3[2].factor + uVar13) = OVar7;
        *(OPJ_UINT32 *)((long)&poVar3[3].factor + uVar13) = OVar7;
      }
      lVar12 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 4;
      auVar17._8_8_ = lVar12 + 4;
      lVar12 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar12 + 4;
      uVar13 = uVar13 + 0x100;
    } while ((uVar11 * 0x40 + 0xc0 & 0xffffffffffffff00) != uVar13);
  }
  if (((p_start_y == 0 && p_start_x == 0) && p_end_x == 0) && p_end_y == 0) {
    opj_event_msg(p_manager,4,
                  "No decoded area parameters, set the decoded area to the whole image\n");
    *(undefined8 *)((long)&p_j2k->m_specific_param + 0x20) = 0;
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = *(OPJ_BYTE **)&(p_j2k->m_cp).tw;
    OVar7 = poVar2->y0;
    OVar4 = poVar2->x1;
    OVar5 = poVar2->y1;
    p_image->x0 = poVar2->x0;
    p_image->y0 = OVar7;
    p_image->x1 = OVar4;
    p_image->y1 = OVar5;
    OVar8 = opj_j2k_update_image_dimensions(p_image,p_manager);
    return OVar8;
  }
  if (p_start_x < 0) {
    pcVar10 = "Left position of the decoded area (region_x0=%d) should be >= 0.\n";
LAB_00111c5e:
    opj_event_msg(p_manager,1,pcVar10,uVar9);
  }
  else {
    if (poVar2->x1 < (uint)p_start_x) {
      pcVar10 = 
      "Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n";
    }
    else {
      if ((uint)p_start_x < poVar2->x0) {
        opj_event_msg(p_manager,2,
                      "Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n"
                     );
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x = 0;
        p_start_x = poVar2->x0;
      }
      else {
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x =
             (p_start_x - (p_j2k->m_cp).tx0) / (p_j2k->m_cp).tdx;
      }
      p_image->x0 = p_start_x;
      if (p_start_y < 0) {
        pcVar10 = "Up position of the decoded area (region_y0=%d) should be >= 0.\n";
        uVar9 = (ulong)(uint)p_start_y;
        goto LAB_00111c5e;
      }
      if (poVar2->y1 < (uint)p_start_y) {
        pcVar10 = 
        "Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n";
        uVar9 = (ulong)(uint)p_start_y;
      }
      else {
        if ((uint)p_start_y < poVar2->y0) {
          opj_event_msg(p_manager,2,
                        "Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n"
                        ,(ulong)(uint)p_start_y);
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y = 0;
          p_start_y = poVar2->y0;
        }
        else {
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y =
               (p_start_y - (p_j2k->m_cp).ty0) / (p_j2k->m_cp).tdy;
        }
        p_image->y0 = p_start_y;
        if (p_end_x < 1) {
          pcVar10 = "Right position of the decoded area (region_x1=%d) should be > 0.\n";
          uVar9 = (ulong)(uint)p_end_x;
          goto LAB_00111c5e;
        }
        if ((uint)p_end_x < poVar2->x0) {
          pcVar10 = 
          "Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n"
          ;
          uVar9 = (ulong)(uint)p_end_x;
        }
        else {
          if (poVar2->x1 < (uint)p_end_x) {
            opj_event_msg(p_manager,2,
                          "Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n"
                          ,(ulong)(uint)p_end_x);
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x = (p_j2k->m_cp).tw;
            p_end_x = poVar2->x1;
          }
          else {
            OVar7 = opj_int_ceildiv(p_end_x - (p_j2k->m_cp).tx0,(p_j2k->m_cp).tdx);
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x = OVar7;
          }
          p_image->x1 = p_end_x;
          uVar9 = (ulong)(uint)p_end_y;
          if (p_end_y < 1) {
            pcVar10 = "Bottom position of the decoded area (region_y1=%d) should be > 0.\n";
            goto LAB_00111c5e;
          }
          if (poVar2->y0 <= (uint)p_end_y) {
            if (poVar2->y1 < (uint)p_end_y) {
              opj_event_msg(p_manager,2,
                            "Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n"
                           );
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y = (p_j2k->m_cp).th;
              p_end_y = poVar2->y1;
            }
            else {
              OVar7 = opj_int_ceildiv(p_end_y - (p_j2k->m_cp).ty0,(p_j2k->m_cp).tdy);
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y = OVar7;
            }
            p_image->y1 = p_end_y;
            pbVar1 = (byte *)((long)&p_j2k->m_specific_param + 0x50);
            *pbVar1 = *pbVar1 | 2;
            OVar8 = opj_j2k_update_image_dimensions(p_image,p_manager);
            if (OVar8 != 0) {
              opj_event_msg(p_manager,4,"Setting decoding area to %d,%d,%d,%d\n",(ulong)p_image->x0,
                            (ulong)p_image->y0,(ulong)p_image->x1,p_image->y1);
              return OVar8;
            }
            return 0;
          }
          pcVar10 = 
          "Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n"
          ;
        }
      }
    }
    opj_event_msg(p_manager,1,pcVar10,uVar9);
  }
  return 0;
}

Assistant:

OPJ_BOOL opj_j2k_set_decode_area(opj_j2k_t *p_j2k,
                                 opj_image_t* p_image,
                                 OPJ_INT32 p_start_x, OPJ_INT32 p_start_y,
                                 OPJ_INT32 p_end_x, OPJ_INT32 p_end_y,
                                 opj_event_mgr_t * p_manager)
{
    opj_cp_t * l_cp = &(p_j2k->m_cp);
    opj_image_t * l_image = p_j2k->m_private_image;
    OPJ_BOOL ret;
    OPJ_UINT32 it_comp;

    if (p_j2k->m_cp.tw == 1 && p_j2k->m_cp.th == 1 &&
            p_j2k->m_cp.tcps[0].m_data != NULL) {
        /* In the case of a single-tiled image whose codestream we have already */
        /* ingested, go on */
    }
    /* Check if we are read the main header */
    else if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Need to decode the main header before begin to decode the remaining codestream.\n");
        return OPJ_FALSE;
    }

    /* Update the comps[].factor member of the output image with the one */
    /* of m_reduce */
    for (it_comp = 0; it_comp < p_image->numcomps; ++it_comp) {
        p_image->comps[it_comp].factor = p_j2k->m_cp.m_specific_param.m_dec.m_reduce;
    }

    if (!p_start_x && !p_start_y && !p_end_x && !p_end_y) {
        opj_event_msg(p_manager, EVT_INFO,
                      "No decoded area parameters, set the decoded area to the whole image\n");

        p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
        p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
        p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
        p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;

        p_image->x0 = l_image->x0;
        p_image->y0 = l_image->y0;
        p_image->x1 = l_image->x1;
        p_image->y1 = l_image->y1;

        return opj_j2k_update_image_dimensions(p_image, p_manager);
    }

    /* ----- */
    /* Check if the positions provided by the user are correct */

    /* Left */
    if (p_start_x < 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Left position of the decoded area (region_x0=%d) should be >= 0.\n",
                      p_start_x);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_start_x > l_image->x1) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n",
                      p_start_x, l_image->x1);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_start_x < l_image->x0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n",
                      p_start_x, l_image->x0);
        p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
        p_image->x0 = l_image->x0;
    } else {
        p_j2k->m_specific_param.m_decoder.m_start_tile_x = ((OPJ_UINT32)p_start_x -
                l_cp->tx0) / l_cp->tdx;
        p_image->x0 = (OPJ_UINT32)p_start_x;
    }

    /* Up */
    if (p_start_y < 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Up position of the decoded area (region_y0=%d) should be >= 0.\n",
                      p_start_y);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_start_y > l_image->y1) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n",
                      p_start_y, l_image->y1);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_start_y < l_image->y0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n",
                      p_start_y, l_image->y0);
        p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
        p_image->y0 = l_image->y0;
    } else {
        p_j2k->m_specific_param.m_decoder.m_start_tile_y = ((OPJ_UINT32)p_start_y -
                l_cp->ty0) / l_cp->tdy;
        p_image->y0 = (OPJ_UINT32)p_start_y;
    }

    /* Right */
    if (p_end_x <= 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Right position of the decoded area (region_x1=%d) should be > 0.\n",
                      p_end_x);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_end_x < l_image->x0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n",
                      p_end_x, l_image->x0);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_end_x > l_image->x1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n",
                      p_end_x, l_image->x1);
        p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
        p_image->x1 = l_image->x1;
    } else {
        p_j2k->m_specific_param.m_decoder.m_end_tile_x = (OPJ_UINT32)opj_int_ceildiv(
                    p_end_x - (OPJ_INT32)l_cp->tx0, (OPJ_INT32)l_cp->tdx);
        p_image->x1 = (OPJ_UINT32)p_end_x;
    }

    /* Bottom */
    if (p_end_y <= 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Bottom position of the decoded area (region_y1=%d) should be > 0.\n",
                      p_end_y);
        return OPJ_FALSE;
    } else if ((OPJ_UINT32)p_end_y < l_image->y0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n",
                      p_end_y, l_image->y0);
        return OPJ_FALSE;
    }
    if ((OPJ_UINT32)p_end_y > l_image->y1) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n",
                      p_end_y, l_image->y1);
        p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;
        p_image->y1 = l_image->y1;
    } else {
        p_j2k->m_specific_param.m_decoder.m_end_tile_y = (OPJ_UINT32)opj_int_ceildiv(
                    p_end_y - (OPJ_INT32)l_cp->ty0, (OPJ_INT32)l_cp->tdy);
        p_image->y1 = (OPJ_UINT32)p_end_y;
    }
    /* ----- */

    p_j2k->m_specific_param.m_decoder.m_discard_tiles = 1;

    ret = opj_j2k_update_image_dimensions(p_image, p_manager);

    if (ret) {
        opj_event_msg(p_manager, EVT_INFO, "Setting decoding area to %d,%d,%d,%d\n",
                      p_image->x0, p_image->y0, p_image->x1, p_image->y1);
    }

    return ret;
}